

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryCompileCommand.cxx
# Opt level: O0

bool __thiscall
cmTryCompileCommand::InitialPass
          (cmTryCompileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argv,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  WorkingMode WVar2;
  size_type sVar3;
  cmake *pcVar4;
  char *binDir;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argv_local;
  cmTryCompileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)argv;
  argv_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(argv);
  if (sVar3 < 3) {
    this_local._7_1_ = false;
  }
  else {
    pcVar4 = cmMakefile::GetCMakeInstance((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    WVar2 = cmake::GetWorkingMode(pcVar4);
    if (WVar2 == FIND_PACKAGE_MODE) {
      this_00 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,
                 "The TRY_COMPILE() command is not supported in --find-package mode.",&local_49);
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_48,false);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      this_local._7_1_ = false;
    }
    else {
      cmCoreTryCompile::TryCompileCode
                (&this->super_cmCoreTryCompile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      if (((this->super_cmCoreTryCompile).SrcFileSignature & 1U) != 0) {
        pcVar4 = cmMakefile::GetCMakeInstance
                           ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
        bVar1 = cmake::GetDebugTryCompile(pcVar4);
        if (!bVar1) {
          binDir = (char *)std::__cxx11::string::c_str();
          cmCoreTryCompile::CleanupFiles(&this->super_cmCoreTryCompile,binDir);
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmTryCompileCommand
::InitialPass(std::vector<std::string> const& argv, cmExecutionStatus &)
{
  if(argv.size() < 3)
    {
    return false;
    }

  if(this->Makefile->GetCMakeInstance()->GetWorkingMode() ==
                                                      cmake::FIND_PACKAGE_MODE)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
         "The TRY_COMPILE() command is not supported in --find-package mode.");
    return false;
    }

  this->TryCompileCode(argv);

  // if They specified clean then we clean up what we can
  if (this->SrcFileSignature)
    {
    if(!this->Makefile->GetCMakeInstance()->GetDebugTryCompile())
      {
      this->CleanupFiles(this->BinaryDirectory.c_str());
      }
    }
  return true;
}